

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::calc_divu(PeleLM *this,Real time,Real dt,MultiFab *divu)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  _Head_base<0UL,_amrex::MultiFab_*,_false> this_01;
  FabArray<amrex::FArrayBox> *this_02;
  FabArray<amrex::FArrayBox> *this_03;
  FabArray<amrex::FArrayBox> *this_04;
  long lVar4;
  long lVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  bool bVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar17;
  undefined8 in_XMM1_Qb;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  Real cpor [9];
  Real tresult [9];
  MFIter mfi;
  Real y [9];
  MultiFab RhoYdotTmp;
  MultiFab mcViscTerms;
  double local_9c8 [6];
  undefined1 local_998 [16];
  undefined1 *local_988;
  undefined1 local_978 [16];
  double local_968;
  double dStack_960;
  undefined1 local_958 [16];
  double local_948;
  double dStack_940;
  double local_938;
  Real local_928;
  undefined8 uStack_920;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_910;
  FabArray<amrex::FArrayBox> *local_908;
  FabArray<amrex::FArrayBox> *local_900;
  long local_8f8;
  long local_8f0;
  double *local_8e8;
  long local_8e0;
  long local_8d8;
  double *local_8d0;
  long local_8c8;
  long local_8c0;
  double *local_8b8;
  long local_8b0;
  long local_8a8;
  double *local_8a0;
  long local_898;
  long local_890;
  double *local_888;
  long local_880;
  long local_878;
  long local_870;
  long local_868;
  long local_860;
  double *local_858;
  long local_850;
  double *local_848;
  double *local_840;
  long local_838;
  long local_830;
  double *local_828;
  long local_820;
  long local_818;
  long local_810;
  long local_808;
  long local_800;
  long local_7f8;
  long local_7f0;
  long local_7e8;
  long local_7e0;
  long local_7d8;
  long local_7d0;
  long local_7c8;
  long local_7c0;
  long local_7b8;
  long local_7b0;
  long local_7a8;
  long local_7a0;
  double *local_798;
  double *local_790;
  double *local_788;
  double *local_780;
  double *local_778;
  double *local_770;
  double *local_768;
  double *local_760;
  double *local_758;
  long local_750;
  long local_748;
  long local_740;
  long local_738;
  long local_730;
  double *local_728;
  double *local_720;
  double *local_718;
  double *local_710;
  double *local_708;
  double *local_700;
  Box local_6f4;
  undefined1 local_6d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  int local_6b0;
  double local_678;
  undefined8 uStack_670;
  Array4<const_double> local_668;
  Array4<const_double> local_628;
  Array4<const_double> local_5e8;
  Array4<const_double> local_5a8;
  double local_568 [10];
  Array4<double> local_518;
  Array4<const_double> local_4d8;
  Array4<const_double> local_498;
  Array4<const_double> local_458;
  Array4<const_double> local_418;
  double local_3d8 [8];
  undefined1 *local_398;
  double local_388 [8];
  undefined1 *local_348;
  undefined1 local_338 [192];
  IntVect IStack_278;
  int iStack_26c;
  FabArray<amrex::FArrayBox> local_1b0;
  
  bxs = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  dm = &(this->super_NavierStokesBase).super_AmrLevel.dmap;
  this_00._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_338;
  local_338._0_8_ = (_func_int **)0x1;
  local_338._8_8_ = 0;
  local_338._16_8_ = 0;
  local_338._24_8_ = 0;
  local_338._32_8_ = 0;
  local_928 = dt;
  uStack_920 = in_XMM1_Qb;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,bxs,dm,0xb,0,
             (MFInfo *)
             this_00._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_338 + 0x10));
  iVar2 = NavierStokesBase::do_reflux;
  NavierStokesBase::do_reflux = 0;
  compute_differential_diffusion_terms(this,(MultiFab *)&local_1b0,divu,time,local_928,true);
  NavierStokesBase::do_reflux = (int)(iVar2 != 0);
  amrex::MultiFab::MultiFab
            ((MultiFab *)
             this_00._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  this_04 = &amrex::AmrLevel::get_data((AmrLevel *)this,0,time)->super_FabArray<amrex::FArrayBox>;
  if (time == 0.0 && 0.0 < local_928) {
    this_00._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  }
  else if ((time != 0.0) || (NAN(time))) {
    if (local_928 <= 0.0) {
      amrex::Abort_host("bad divu_logic - shouldn\'t be here");
    }
    else {
      local_6d8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_6d8._8_8_ = (FabArrayBase *)0x0;
      local_6c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_6c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_6c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (**(_func_int **)(local_338._0_8_ + 0x10))
                (this_00._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_6c8);
      compute_instantaneous_reaction_rates
                (this,(MultiFab *)
                      this_00._M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                 (MultiFab *)this_04,(Real)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),0,
                 HT_ZERO_GROW_CELLS);
    }
  }
  else {
    local_6d8._0_8_ =
         (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    local_6d8._8_8_ = (FabArrayBase *)0x0;
    local_6c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_6c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_6c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(_func_int **)(local_338._0_8_ + 0x10))
              (this_00._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm,9,0,local_6d8,
               (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6c8);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,iStack_26c,
               &IStack_278);
  }
  amrex::MFIter::MFIter((MFIter *)local_6d8,&this_04->super_FabArrayBase,true);
  if ((int)local_6c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_6b0) {
    local_908 = &(this->external_sources).super_FabArray<amrex::FArrayBox>;
    local_910._M_head_impl =
         (MultiFab *)
         this_00._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    local_900 = &divu->super_FabArray<amrex::FArrayBox>;
    do {
      this_03 = local_900;
      this_02 = local_908;
      this_01._M_head_impl = local_910._M_head_impl;
      amrex::MFIter::tilebox(&local_6f4,(MFIter *)local_6d8);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_5a8,this_04,(MFIter *)local_6d8,first_spec);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_418,this_04,(MFIter *)local_6d8,NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_458,&local_1b0,(MFIter *)local_6d8,10);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_5e8,&local_1b0,(MFIter *)local_6d8,0);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_628,&(this_01._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)local_6d8);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_498,this_02,(MFIter *)local_6d8,3);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_668,this_02,(MFIter *)local_6d8,4);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_4d8,this_02,(MFIter *)local_6d8,0xd);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_518,this_03,(MFIter *)local_6d8);
      if (local_6f4.smallend.vect[2] <= local_6f4.bigend.vect[2]) {
        local_828 = local_5a8.p + -(long)local_5a8.begin.x;
        local_858 = local_668.p + -(long)local_668.begin.x;
        local_848 = local_628.p + -(long)local_628.begin.x;
        local_840 = local_5e8.p + -(long)local_5e8.begin.x;
        local_830 = local_5a8.kstride * 8;
        local_838 = -(long)local_5a8.begin.z;
        local_7a0 = -(long)local_5a8.begin.y;
        local_860 = local_668.kstride * 8;
        local_868 = -(long)local_668.begin.z;
        local_7a8 = local_668.jstride * 8;
        local_7b0 = -(long)local_668.begin.y;
        local_850 = local_628.kstride * 8;
        local_870 = -(long)local_628.begin.z;
        local_7b8 = local_628.jstride * 8;
        local_7c0 = -(long)local_628.begin.y;
        local_878 = local_5e8.kstride * 8;
        local_880 = -(long)local_5e8.begin.z;
        local_7c8 = local_5e8.jstride * 8;
        local_7d0 = -(long)local_5e8.begin.y;
        local_888 = local_418.p;
        local_7d8 = local_418.jstride;
        local_890 = local_418.kstride;
        local_730 = (long)local_418.begin.x;
        local_7e0 = (long)local_418.begin.y;
        local_898 = (long)local_418.begin.z;
        local_8a0 = local_458.p;
        local_7e8 = local_458.jstride;
        local_8a8 = local_458.kstride;
        local_738 = (long)local_458.begin.x;
        local_7f0 = (long)local_458.begin.y;
        local_8b0 = (long)local_458.begin.z;
        local_8b8 = local_518.p;
        local_7f8 = local_518.jstride;
        local_8c0 = local_518.kstride;
        local_740 = (long)local_518.begin.x;
        local_800 = (long)local_518.begin.y;
        local_8c8 = (long)local_518.begin.z;
        local_8d0 = local_498.p;
        local_808 = local_498.jstride;
        local_8d8 = local_498.kstride;
        local_748 = (long)local_498.begin.x;
        local_810 = (long)local_498.begin.y;
        local_8e0 = (long)local_498.begin.z;
        local_8e8 = local_4d8.p;
        local_818 = local_4d8.jstride;
        local_8f0 = local_4d8.kstride;
        local_750 = (long)local_4d8.begin.x;
        local_820 = (long)local_4d8.begin.y;
        local_8f8 = (long)local_4d8.begin.z;
        iVar2 = local_6f4.smallend.vect[2];
        do {
          if (local_6f4.smallend.vect[1] <= local_6f4.bigend.vect[1]) {
            lVar4 = (long)iVar2;
            local_758 = (double *)((local_868 + lVar4) * local_860 + (long)local_858);
            local_760 = (double *)((local_870 + lVar4) * local_850 + (long)local_848);
            local_768 = (double *)((local_880 + lVar4) * local_878 + (long)local_840);
            local_770 = (double *)((local_838 + lVar4) * local_830 + (long)local_828);
            local_778 = local_418.p + (lVar4 - local_898) * local_418.kstride;
            local_780 = local_518.p + (lVar4 - local_8c8) * local_518.kstride;
            local_788 = local_458.p + (lVar4 - local_8b0) * local_458.kstride;
            local_790 = local_498.p + (lVar4 - local_8e0) * local_498.kstride;
            local_798 = local_4d8.p + (lVar4 - local_8f8) * local_4d8.kstride;
            iVar3 = local_6f4.smallend.vect[1];
            do {
              if (local_6f4.smallend.vect[0] <= local_6f4.bigend.vect[0]) {
                lVar4 = (long)iVar3;
                local_700 = (double *)((local_7b0 + lVar4) * local_7a8 + (long)local_758);
                local_708 = (double *)((local_7c0 + lVar4) * local_7b8 + (long)local_760);
                local_710 = (double *)((local_7d0 + lVar4) * local_7c8 + (long)local_768);
                lVar11 = (local_7a0 + lVar4) * local_5a8.jstride * 8;
                lVar5 = (lVar4 - local_7e0) * local_418.jstride;
                lVar8 = (lVar4 - local_800) * local_518.jstride;
                local_718 = local_788 + (lVar4 - local_7f0) * local_458.jstride;
                local_720 = local_790 + (lVar4 - local_810) * local_498.jstride;
                local_728 = local_798 + (lVar4 - local_820) * local_4d8.jstride;
                iVar7 = local_6f4.smallend.vect[0];
                do {
                  lVar4 = (long)iVar7;
                  pdVar15 = local_700 + lVar4;
                  pdVar6 = local_708 + lVar4;
                  pdVar10 = local_710 + lVar4;
                  pdVar13 = (double *)((long)local_770 + lVar4 * 8 + lVar11);
                  pdVar9 = (double *)((long)local_770 + lVar4 * 8 + lVar11);
                  local_3d8[0] = 0.49603174603174605;
                  local_3d8[1] = 0.03125195324707794;
                  local_3d8[2] = 0.055509297807382736;
                  local_3d8[3] = 0.9920634920634921;
                  local_3d8[4] = 0.06250390649415588;
                  local_3d8[5] = 0.05879931792791203;
                  local_3d8[6] = 0.030297521662727988;
                  local_3d8[7] = 0.029399658963956014;
                  local_398 = &DAT_3fa246cdaf410bdd;
                  dVar17 = 0.0;
                  lVar12 = 9;
                  do {
                    dVar17 = dVar17 + *pdVar9;
                    pdVar9 = pdVar9 + local_5a8.nstride;
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                  dVar1 = 1.0 / dVar17;
                  local_568[6] = 0.0;
                  local_568[7] = 0.0;
                  local_568[4] = 0.0;
                  local_568[5] = 0.0;
                  local_568[2] = 0.0;
                  local_568[3] = 0.0;
                  local_568[0] = 0.0;
                  local_568[1] = 0.0;
                  local_568[8] = 0.0;
                  lVar12 = 0;
                  do {
                    local_568[lVar12] = *pdVar13 * dVar1;
                    lVar12 = lVar12 + 1;
                    pdVar13 = pdVar13 + local_5a8.nstride;
                  } while (lVar12 != 9);
                  dVar18 = local_778[lVar5 + (lVar4 - local_730)];
                  dVar23 = dVar18 * dVar18;
                  dVar20 = dVar18 * dVar23;
                  dVar19 = dVar18 * dVar20;
                  local_388[0] = 0.49603174603174605;
                  local_388[1] = 0.03125195324707794;
                  local_388[2] = 0.055509297807382736;
                  local_388[3] = 0.9920634920634921;
                  local_388[4] = 0.06250390649415588;
                  local_388[5] = 0.05879931792791203;
                  local_388[6] = 0.030297521662727988;
                  local_388[7] = 0.029399658963956014;
                  local_348 = &DAT_3fa246cdaf410bdd;
                  local_928 = dVar18 * 0.0;
                  uStack_920 = 0;
                  dVar24 = dVar19 * 0.0;
                  local_9c8[3] = local_928 + 2.5 + dVar23 * 0.0 + dVar20 * 0.0 + dVar24;
                  if (1000.0 <= dVar18) {
                    local_9c8[0] = dVar19 * 1.58275179e-15 +
                                   dVar20 * -9.23157818e-12 +
                                   dVar23 * -5.63382869e-08 + dVar18 * 0.000700064411 + 2.99142337;
                    local_9c8[1] = dVar19 * -1.13643531e-15 +
                                   dVar20 * 1.77528148e-11 +
                                   dVar23 * -1.25884199e-07 + dVar18 * 0.000613519689 + 3.69757819;
                    local_9c8[2] = dVar19 * -6.39161787e-15 +
                                   dVar20 * 1.20099639e-10 +
                                   dVar23 * -8.73026011e-07 + dVar18 * 0.00305629289 + 2.67214561;
                    local_9c8[4] = dVar19 * -4.3680515e-16 +
                                   dVar20 * 4.55106742e-12 +
                                   dVar23 * -3.10280335e-09 + dVar18 * -2.75506191e-05 + 2.54205966;
                    local_9c8[5] = dVar19 * -1.33195876e-15 +
                                   dVar20 * 3.05218674e-11 +
                                   dVar23 * -2.59082758e-07 + dVar18 * 0.00105650448 + 2.86472886;
                    local_998._8_8_ =
                         dVar19 * -1.43165356e-14 +
                         dVar20 * 2.34890357e-10 +
                         dVar23 * -1.47468882e-06 + dVar18 * 0.00433613639 + 4.57316685;
                    local_998._0_8_ =
                         dVar19 * -1.07908535e-14 +
                         dVar20 * 1.1424637e-10 +
                         dVar23 * -6.3365815e-07 + dVar18 * 0.00223982013 + 4.0172109;
                    dVar22 = dVar20 * 1.009704e-10 +
                             dVar23 * -5.684761e-07 + dVar18 * 0.001487977 + 2.92664;
                    dVar21 = dVar19 * -6.753351e-15;
                  }
                  else {
                    uStack_670 = 0;
                    local_9c8[0] = dVar19 * 4.13487224e-13 +
                                   dVar20 * -9.47543433e-11 +
                                   dVar23 * -8.14301529e-07 + dVar18 * 0.000824944174 + 3.29812431;
                    local_9c8[1] = dVar19 * -8.76855392e-13 +
                                   dVar20 * 1.31387723e-09 +
                                   dVar23 * -5.75615047e-07 + dVar18 * 0.00112748635 + 3.2129364;
                    local_9c8[2] = dVar19 * -2.50658847e-12 +
                                   dVar20 * 6.96858127e-09 +
                                   dVar23 * -6.35469633e-06 + dVar18 * 0.00347498246 + 3.38684249;
                    local_9c8[4] = dVar19 * 3.89069636e-13 +
                                   dVar20 * -1.60284319e-09 +
                                   dVar23 * 2.4210317e-06 + dVar18 * -0.00163816649 + 2.94642878;
                    local_9c8[5] = dVar19 * 2.06237379e-12 +
                                   dVar20 * -5.79853643e-09 +
                                   dVar23 * 6.52764691e-06 + dVar18 * -0.00322544939 + 4.12530561;
                    dVar22 = dVar19 * 2.47151475e-12 +
                             dVar20 * -4.62580552e-09 +
                             dVar23 * -1.48501258e-07 + dVar18 * 0.00656922581 + 3.38875365;
                    local_998._8_4_ = SUB84(dVar22,0);
                    local_998._0_8_ =
                         dVar19 * 9.29225124e-12 +
                         dVar20 * -2.42763894e-08 +
                         dVar23 * 2.11582891e-05 + dVar18 * -0.00474912051 + 4.30179801;
                    local_998._12_4_ = (int)((ulong)dVar22 >> 0x20);
                    dVar22 = dVar20 * 5.641515e-09 +
                             dVar23 * -3.963222e-06 + dVar18 * 0.00140824 + 3.298677;
                    dVar21 = dVar19 * -2.444855e-12;
                    local_678 = dVar24;
                  }
                  local_988 = (undefined1 *)(dVar21 + dVar22);
                  lVar12 = 0;
                  do {
                    *(double *)(local_978 + lVar12 * 8) =
                         local_9c8[lVar12] * local_568[lVar12] * local_388[lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 9);
                  dVar22 = 0.0;
                  lVar12 = 0;
                  do {
                    dVar22 = dVar22 + *(double *)(local_978 + lVar12 * 8);
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 9);
                  local_9c8[0] = 0.49603174603174605;
                  local_9c8[1] = 0.03125195324707794;
                  local_9c8[2] = 0.055509297807382736;
                  local_9c8[3] = 0.9920634920634921;
                  local_9c8[4] = 0.06250390649415588;
                  local_9c8[5] = 0.05879931792791203;
                  local_998._8_8_ = 0x3f9e1af1b70e12fe;
                  local_998._0_8_ = 0x3f9f065042c3dbd3;
                  local_988 = &DAT_3fa246cdaf410bdd;
                  dVar21 = 0.0;
                  lVar12 = 0;
                  do {
                    dVar21 = dVar21 + local_568[lVar12] * local_9c8[lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 9);
                  local_9c8[0] = 0.49603174603174605;
                  local_9c8[1] = 0.03125195324707794;
                  local_9c8[2] = 0.055509297807382736;
                  local_9c8[3] = 0.9920634920634921;
                  local_9c8[4] = 0.06250390649415588;
                  local_9c8[5] = 0.05879931792791203;
                  local_998._8_8_ = 0x3f9e1af1b70e12fe;
                  local_998._0_8_ = 0x3f9f065042c3dbd3;
                  local_988 = &DAT_3fa246cdaf410bdd;
                  dVar25 = 1.0 / dVar18;
                  dStack_960 = dVar25 * 25471.627 +
                               dVar24 + dVar20 * 0.0 + dVar23 * 0.0 + local_928 + 2.5;
                  if (1000.0 <= dVar18) {
                    dVar24 = dVar25 * -1233.93018 +
                             dVar19 * -2.27287062e-16 +
                             dVar20 * 4.4382037e-12 +
                             dVar23 * -4.19613997e-08 + dVar18 * 0.000306759845 + 3.69757819;
                    local_978._8_4_ = SUB84(dVar24,0);
                    local_978._0_8_ =
                         dVar25 * -835.033997 +
                         dVar19 * 3.16550358e-16 +
                         dVar20 * -2.30789455e-12 +
                         dVar23 * -1.8779429e-08 + dVar18 * 0.000350032206 + 2.99142337;
                    local_978._12_4_ = (int)((ulong)dVar24 >> 0x20);
                    local_968 = dVar25 * -29899.209 +
                                dVar19 * -1.27832357e-15 +
                                dVar20 * 3.00249098e-11 +
                                dVar23 * -2.9100867e-07 + dVar18 * 0.00152814644 + 2.67214561;
                    dVar24 = dVar25 * 3683.62875 +
                             dVar19 * -2.66391752e-16 +
                             dVar20 * 7.63046685e-12 +
                             dVar23 * -8.63609193e-08 + dVar18 * 0.00052825224 + 2.86472886;
                    local_958._8_4_ = SUB84(dVar24,0);
                    local_958._0_8_ =
                         dVar25 * 29230.8027 +
                         dVar19 * -8.736103e-17 +
                         dVar20 * 1.13776685e-12 +
                         dVar23 * -1.03426778e-09 + dVar18 * -1.37753096e-05 + 2.54205966;
                    local_958._12_4_ = (int)((ulong)dVar24 >> 0x20);
                    local_948 = dVar25 * 111.856713 +
                                dVar19 * -2.1581707e-15 +
                                dVar20 * 2.85615925e-11 +
                                dVar23 * -2.11219383e-07 + dVar18 * 0.00111991006 + 4.0172109;
                    dStack_940 = dVar25 * -18006.9609 +
                                 dVar19 * -2.86330712e-15 +
                                 dVar20 * 5.87225893e-11 +
                                 dVar23 * -4.9156294e-07 + dVar18 * 0.0021680682 + 4.57316685;
                    dVar19 = dVar19 * -1.3506702e-15 +
                             dVar20 * 2.52426e-11 +
                             dVar23 * -1.89492033e-07 + dVar18 * 0.0007439885 + 2.92664;
                    dVar25 = dVar25 * -922.7977;
                  }
                  else {
                    dVar24 = dVar25 * -1005.24902 +
                             dVar19 * -1.75371078e-13 +
                             dVar20 * 3.28469308e-10 +
                             dVar23 * -1.91871682e-07 + dVar18 * 0.000563743175 + 3.2129364;
                    local_978._8_4_ = SUB84(dVar24,0);
                    local_978._0_8_ =
                         dVar25 * -1012.52087 +
                         dVar19 * 8.26974448e-14 +
                         dVar20 * -2.36885858e-11 +
                         dVar23 * -2.71433843e-07 + dVar18 * 0.000412472087 + 3.29812431;
                    local_978._12_4_ = (int)((ulong)dVar24 >> 0x20);
                    local_968 = dVar25 * -30208.1133 +
                                dVar19 * -5.01317694e-13 +
                                dVar20 * 1.74214532e-09 +
                                dVar23 * -2.11823211e-06 + dVar18 * 0.00173749123 + 3.38684249;
                    dVar24 = dVar25 * 3346.30913 +
                             dVar19 * 4.12474758e-13 +
                             dVar20 * -1.44963411e-09 +
                             dVar23 * 2.1758823e-06 + dVar18 * -0.0016127247 + 4.12530561;
                    local_958._8_4_ = SUB84(dVar24,0);
                    local_958._0_8_ =
                         dVar25 * 29147.6445 +
                         dVar19 * 7.78139272e-14 +
                         dVar20 * -4.00710797e-10 +
                         dVar23 * 8.07010567e-07 + dVar18 * -0.000819083245 + 2.94642878;
                    local_958._12_4_ = (int)((ulong)dVar24 >> 0x20);
                    local_948 = dVar25 * 294.80804 +
                                dVar19 * 1.85845025e-12 +
                                dVar20 * -6.06909735e-09 +
                                dVar23 * 7.05276303e-06 + dVar18 * -0.00237456025 + 4.30179801;
                    dStack_940 = dVar25 * -17663.1465 +
                                 dVar19 * 4.9430295e-13 +
                                 dVar20 * -1.15645138e-09 +
                                 dVar23 * -4.95004193e-08 + dVar18 * 0.0032846129 + 3.38875365;
                    dVar19 = dVar19 * -4.88971e-13 +
                             dVar20 * 1.41037875e-09 +
                             dVar23 * -1.321074e-06 + dVar18 * 0.00070412 + 3.298677;
                    dVar25 = dVar25 * -1020.9;
                  }
                  local_938 = dVar25 + dVar19;
                  lVar12 = 0;
                  do {
                    *(double *)(local_978 + lVar12 * 8) =
                         local_9c8[lVar12] * dVar18 * 83144626.1815324 *
                         *(double *)(local_978 + lVar12 * 8);
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 9);
                  lVar12 = 0;
                  do {
                    *(double *)(local_978 + lVar12 * 8) =
                         *(double *)(local_978 + lVar12 * 8) * 0.0001;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 9);
                  lVar14 = lVar4 - local_740;
                  dVar18 = 1.0 / (dVar17 * dVar22 * 83144626.1815324 * 0.0001 *
                                 local_778[lVar5 + (lVar4 - local_730)]);
                  dVar17 = (local_780[lVar8 + lVar14] + local_718[lVar4 - local_738]) * dVar18;
                  local_780[lVar8 + lVar14] = dVar17;
                  lVar12 = 0;
                  do {
                    dVar19 = local_3d8[lVar12];
                    dVar17 = ((1.0 / dVar21) * dVar19 * dVar1 -
                             *(double *)(local_978 + lVar12 * 8) * dVar18) * (*pdVar10 + *pdVar6) +
                             dVar17;
                    local_780[lVar8 + lVar14] = dVar17;
                    dVar17 = dVar19 * *pdVar15 * (1.0 / dVar21) * dVar1 + dVar17;
                    local_780[lVar8 + lVar14] = dVar17;
                    lVar12 = lVar12 + 1;
                    pdVar15 = pdVar15 + local_668.nstride;
                    pdVar6 = pdVar6 + local_628.nstride;
                    pdVar10 = pdVar10 + local_5e8.nstride;
                  } while (lVar12 != 9);
                  dVar17 = dVar1 * local_720[lVar4 - local_748] + dVar17;
                  local_780[lVar8 + lVar14] = dVar17;
                  local_780[lVar8 + lVar14] = dVar18 * local_728[lVar4 - local_750] + dVar17;
                  bVar16 = iVar7 != local_6f4.bigend.vect[0];
                  iVar7 = iVar7 + 1;
                } while (bVar16);
              }
              bVar16 = iVar3 != local_6f4.bigend.vect[1];
              iVar3 = iVar3 + 1;
            } while (bVar16);
          }
          bVar16 = iVar2 != local_6f4.bigend.vect[2];
          iVar2 = iVar2 + 1;
        } while (bVar16);
      }
      amrex::MFIter::operator++((MFIter *)local_6d8);
      divu = (MultiFab *)local_900;
    } while ((int)local_6c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_6b0);
  }
  amrex::MFIter::~MFIter((MFIter *)local_6d8);
  amrex::EB_set_covered(divu,0.0);
  amrex::MultiFab::~MultiFab((MultiFab *)local_338);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
PeleLM::calc_divu (Real      time,
                   Real      dt,
                   MultiFab& divu)
{
   BL_PROFILE("PLM::calc_divu()");

   const int nGrow = 0;
   int vtCompT = NUM_SPECIES + 1;
   int vtCompY = 0;
   MultiFab mcViscTerms(grids,dmap,NUM_SPECIES+2,nGrow,MFInfo(),Factory());

   // we don't want to update flux registers due to fluxes in divu computation
   bool do_reflux_hold = do_reflux;
   do_reflux = false;

   // DD is computed and stored in divu, and passed in to initialize the calc of divu
   bool include_Wbar_terms = true;
   compute_differential_diffusion_terms(mcViscTerms,divu,time,dt,include_Wbar_terms);

   do_reflux = do_reflux_hold;

   // if we are in the initial projection (time=0, dt=-1), set RhoYdot=0
   // if we are in a divu_iter (time=0, dt>0), use I_R
   // if we are in an init_iter or regular time step (time=dt, dt>0), use instananeous
   MultiFab   RhoYdotTmp;
   MultiFab&  S       = get_data(State_Type,time);
   const bool use_IR  = (time == 0 && dt > 0);

   MultiFab& RhoYdot = (use_IR) ? get_new_data(RhoYdot_Type) : RhoYdotTmp;

   if (!use_IR)
   {
     if (time == 0)
     {
       // initial projection, set omegadot to zero
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       RhoYdot.setVal(0.0);
     }
     else if (dt > 0)
     {
       // init_iter or regular time step, use instantaneous omegadot
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       compute_instantaneous_reaction_rates(RhoYdot,S,time,nGrow);
     }
     else
     {
       amrex::Abort("bad divu_logic - shouldn't be here");
     }
   }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY    = S.const_array(mfi,first_spec);
      auto const& T       = S.const_array(mfi,Temp);
      auto const& vtT     = mcViscTerms.const_array(mfi,vtCompT);
      auto const& vtY     = mcViscTerms.const_array(mfi,vtCompY);
      auto const& rhoYdot = RhoYdot.const_array(mfi);
      auto const& extRho  = external_sources.const_array(mfi,Density);
      auto const& extY    = external_sources.const_array(mfi,DEF_first_spec);
      auto const& extRhoH = external_sources.const_array(mfi,DEF_RhoH);
      auto const& du      = divu.array(mfi);

      amrex::ParallelFor(bx, [ rhoY, T, vtT, vtY, rhoYdot, du, extRho, extY, extRhoH]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         compute_divu( i, j, k, rhoY, T, vtT, vtY, rhoYdot, extRho, extY, extRhoH, du );
      });
   }

#ifdef AMREX_USE_EB
   EB_set_covered(divu,0.);
#endif
}